

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_trie.hpp
# Opt level: O3

node_map * __thiscall
poplar::
compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::expand(node_map *__return_storage_ptr__,
        compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
        *this)

{
  compact_vector *this_00;
  uint64_t uVar1;
  pointer puVar2;
  byte bVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar4;
  vector<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  *pvVar5;
  unsigned_long uVar6;
  pointer puVar7;
  node_map *pnVar8;
  undefined8 uVar9;
  pointer puVar10;
  ulong uVar11;
  ulong uVar12;
  uint32_t width;
  ulong uVar13;
  uint64_t uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  compact_vector *this_01;
  ulong uVar18;
  ulong uVar19;
  pointer ppVar20;
  pair<unsigned_long,_unsigned_long> pVar21;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  path;
  bit_vector done_flags;
  uint64_t new_node_id;
  this_type new_ht;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_358;
  pair<unsigned_long,_unsigned_long> local_338;
  pointer local_328;
  pointer puStack_320;
  pointer puStack_318;
  pointer puStack_310;
  undefined1 local_308 [16];
  pointer puStack_2f8;
  uint64_t local_2f0;
  uint64_t *local_2e8;
  ulong local_2e0;
  node_map *local_2d8;
  ulong local_2d0;
  undefined1 local_2c8 [32];
  pointer puStack_2a8;
  pointer local_2a0;
  uint64_t local_298;
  uint64_t uStack_290;
  uint64_t local_288;
  split_mix_hasher local_280;
  pointer local_268;
  pointer puStack_260;
  pointer local_258;
  uint64_t local_250;
  uint64_t uStack_248;
  uint64_t local_240;
  uint64_t local_238;
  uint64_t uStack_230;
  size_p2 sStack_228;
  size_p2 sStack_218;
  size_p2 sStack_208;
  uint64_t uStack_1f8;
  uint64_t uStack_1f0;
  pointer local_1e8;
  pointer psStack_1e0;
  pointer local_1d8;
  uint64_t local_1d0;
  uint64_t uStack_1c8;
  size_p2 sStack_1c0;
  uint64_t uStack_1b0;
  uint64_t uStack_1a8;
  size_p2 local_1a0;
  size_p2 sStack_190;
  compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  local_178;
  
  compact_bonsai_trie(&local_178,(this->capa_size_).bits_ + 1,(this->symb_size_).bits_,0);
  local_178.size_ = 1;
  bit_vector::bit_vector((bit_vector *)local_308,(this->capa_size_).mask_ + 1);
  *(ulong *)local_308._0_8_ = *(ulong *)local_308._0_8_ | 1;
  uVar13 = (this->table_).width_;
  puStack_318 = (pointer)0x0;
  puStack_310 = (pointer)0x0;
  local_338 = (pair<unsigned_long,_unsigned_long>)ZEXT816(0);
  local_328 = (pointer)0x0;
  puStack_320 = (pointer)0x0;
  width = local_178.capa_size_.bits_ - (uint)uVar13;
  if ((uint)uVar13 <= local_178.capa_size_.bits_ && width != 0) {
    compact_vector::compact_vector((compact_vector *)local_2c8,(this->capa_size_).mask_ + 1,width);
    uVar9 = local_2c8._16_8_;
    puVar10 = local_328;
    uVar6 = local_338.first;
    local_2c8._16_8_ = (pointer)0x0;
    local_338.first = local_2c8._0_8_;
    local_338.second = local_2c8._8_8_;
    local_2c8._0_16_ = ZEXT816(0) << 0x20;
    local_328 = (pointer)uVar9;
    if ((pointer)uVar6 == (pointer)0x0) {
      puStack_310 = local_2a0;
      puStack_320 = (pointer)local_2c8._24_8_;
      puStack_318 = puStack_2a8;
    }
    else {
      operator_delete((void *)uVar6,(long)puVar10 - uVar6);
      puStack_310 = local_2a0;
      puStack_320 = (pointer)local_2c8._24_8_;
      puStack_318 = puStack_2a8;
      if ((pointer)local_2c8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ - local_2c8._0_8_);
      }
    }
  }
  local_358.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pair<unsigned_long,_unsigned_long> *)0x0;
  local_358.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pair<unsigned_long,_unsigned_long> *)0x0;
  local_358.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pair<unsigned_long,_unsigned_long> *)0x0;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::reserve(&local_358,0x100);
  local_2e8 = &(this->table_).size_;
  uVar14 = (this->table_).size_;
  this_00 = &this->table_;
  puVar10 = (pointer)local_308._0_8_;
  local_2d8 = __return_storage_ptr__;
  if (1 < uVar14) {
    local_2e0 = uVar13 & 0xffffffff;
    uVar15 = 1;
    local_2d0 = ~(-1L << (uVar13 & 0x3f));
    do {
      if ((puVar10[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) == 0) {
        uVar1 = (this->table_).width_;
        puVar2 = (this->table_).chunks_.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar11 = uVar1 * uVar15;
        uVar12 = (ulong)((uint)uVar11 & 0x3f);
        uVar13 = puVar2[uVar11 >> 6];
        if (uVar1 + uVar12 < 0x41) {
          uVar16 = (uint)(uVar13 >> uVar12);
        }
        else {
          bVar3 = (byte)uVar11 & 0x3f;
          uVar16 = (uint)(uVar13 >> bVar3) | (uint)(puVar2[(uVar11 >> 6) + 1] << 0x40 - bVar3);
        }
        if ((uVar16 & (uint)(this->table_).mask_ & 7) != 0) {
          uVar13 = uVar15;
          if (local_358.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_358.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            local_358.
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_358.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          }
          do {
            pVar21 = get_parent_and_symb(this,uVar13);
            uVar11 = pVar21.first;
            local_2c8._8_8_ = pVar21.second;
            local_2c8._0_8_ = uVar13;
            if (local_358.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_358.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                        ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                          *)&local_358,
                         (iterator)
                         local_358.
                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         (pair<unsigned_long,_unsigned_long> *)local_2c8);
            }
            else {
              (local_358.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->first = uVar13;
              (local_358.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->second = pVar21.second;
              local_358.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_358.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar13 = uVar11;
          } while ((*(ulong *)(local_308._0_8_ + (uVar11 >> 6) * 8) >> (uVar11 & 0x3f) & 1) == 0);
          uVar14 = (this->table_).width_;
          puVar10 = (this->table_).chunks_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar12 = uVar14 * uVar11;
          uVar18 = uVar12 >> 6;
          uVar17 = (ulong)((uint)uVar12 & 0x3f);
          uVar19 = uVar14 + uVar17;
          uVar13 = puVar10[uVar18];
          if (puStack_320 == (pointer)0x0) {
            if (uVar19 < 0x41) {
              uVar13 = uVar13 >> uVar17;
            }
            else {
              bVar3 = (byte)uVar12 & 0x3f;
              uVar13 = uVar13 >> bVar3 | puVar10[uVar18 + 1] << 0x40 - bVar3;
            }
            uVar13 = uVar13 & (this->table_).mask_;
          }
          else {
            if (uVar19 < 0x41) {
              uVar13 = uVar13 >> uVar17;
            }
            else {
              bVar3 = (byte)uVar12 & 0x3f;
              uVar13 = uVar13 >> bVar3 | puVar10[uVar18 + 1] << 0x40 - bVar3;
            }
            uVar11 = uVar11 * (long)puStack_310;
            uVar12 = (ulong)((uint)uVar11 & 0x3f);
            if ((long)puStack_310 + uVar12 < 0x41) {
              uVar11 = *(ulong *)(local_338.first + (uVar11 >> 6) * 8) >> uVar12;
            }
            else {
              bVar3 = (byte)uVar11 & 0x3f;
              uVar11 = *(ulong *)(local_338.first + (uVar11 >> 6) * 8) >> bVar3 |
                       *(pointer)(local_338.first + ((uVar11 >> 6) + 1) * 8) << 0x40 - bVar3;
            }
            uVar13 = (uVar11 & (ulong)puStack_318) << (local_2e0 & 0x3f) |
                     uVar13 & (this->table_).mask_;
          }
          local_2c8._0_8_ = uVar13;
          ppVar20 = local_358.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          while (ppVar20 !=
                 local_358.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
            add_child(&local_178,(uint64_t *)local_2c8,ppVar20[-1].second);
            ppVar20 = ppVar20 + -1;
            uVar9 = local_2c8._0_8_;
            uVar14 = ppVar20->first;
            this_01 = this_00;
            puVar10 = (pointer)local_2c8._0_8_;
            if (puStack_320 != (pointer)0x0) {
              compact_vector::set(this_00,uVar14,local_2c8._0_8_ & local_2d0);
              this_01 = (compact_vector *)&local_338;
              puVar10 = (pointer)((ulong)uVar9 >> (local_2e0 & 0x3f));
            }
            compact_vector::set(this_01,uVar14,(uint64_t)puVar10);
            *(ulong *)(local_308._0_8_ + (ppVar20->first >> 6) * 8) =
                 *(ulong *)(local_308._0_8_ + (ppVar20->first >> 6) * 8) |
                 1L << (ppVar20->first & 0x3f);
          }
          uVar14 = *local_2e8;
          puVar10 = (pointer)local_308._0_8_;
        }
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < uVar14);
  }
  pnVar8 = local_2d8;
  puVar7 = puStack_2f8;
  (local_2d8->map_high_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_338.first;
  (local_2d8->map_high_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_338.second;
  local_338 = (pair<unsigned_long,_unsigned_long>)(ZEXT816(0) << 0x20);
  (local_2d8->map_high_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_328;
  local_328 = (pointer)0x0;
  (local_2d8->map_high_).width_ = (uint64_t)puStack_310;
  (local_2d8->map_high_).size_ = (uint64_t)puStack_320;
  (local_2d8->map_high_).mask_ = (uint64_t)puStack_318;
  puVar2 = (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (local_2d8->map_low_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (local_2d8->map_low_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = puVar2;
  (local_2d8->map_low_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  uVar14 = local_2e8[1];
  (local_2d8->map_low_).size_ = *local_2e8;
  (local_2d8->map_low_).mask_ = uVar14;
  puStack_2f8 = (pointer)0x0;
  (local_2d8->map_low_).width_ = local_2e8[2];
  (local_2d8->done_flags_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_start = puVar10;
  (local_2d8->done_flags_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_308._8_8_;
  (local_2d8->done_flags_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar7;
  (local_2d8->done_flags_).size_ = local_2f0;
  local_2c8._16_8_ = (this->hasher_).univ_size_.mask_;
  local_2c8._0_16_ = *(undefined1 (*) [16])&this->hasher_;
  local_2a0 = (pointer)0x0;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->chunks_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_338.first;
  (this_00->chunks_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_338.second;
  local_288 = local_2e8[2];
  local_298 = *local_2e8;
  uStack_290 = local_2e8[1];
  local_280.shift_ = (this->aux_cht_).hasher_.shift_;
  local_280._4_4_ = *(undefined4 *)&(this->aux_cht_).hasher_.field_0x4;
  local_280.univ_size_.bits_ = (this->aux_cht_).hasher_.univ_size_.bits_;
  local_280.univ_size_._4_4_ = *(undefined4 *)&(this->aux_cht_).hasher_.univ_size_.field_0x4;
  local_280.univ_size_.mask_ = (this->aux_cht_).hasher_.univ_size_.mask_;
  local_268 = (this->aux_cht_).table_.chunks_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
  puStack_260 = (this->aux_cht_).table_.chunks_.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_258 = (this->aux_cht_).table_.chunks_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  (this->aux_cht_).table_.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar4 = &(this->aux_cht_).table_.chunks_;
  (pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_338.first;
  (pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_338.second;
  local_240 = (this->aux_cht_).table_.width_;
  local_250 = (this->aux_cht_).table_.size_;
  uStack_248 = (this->aux_cht_).table_.mask_;
  local_238 = (this->aux_cht_).size_;
  uStack_230 = (this->aux_cht_).max_size_;
  sStack_228.bits_ = (this->aux_cht_).univ_size_.bits_;
  sStack_228._4_4_ = *(undefined4 *)&(this->aux_cht_).univ_size_.field_0x4;
  sStack_228.mask_ = (this->aux_cht_).univ_size_.mask_;
  sStack_218.bits_ = (this->aux_cht_).capa_size_.bits_;
  sStack_218._4_4_ = *(undefined4 *)&(this->aux_cht_).capa_size_.field_0x4;
  sStack_218.mask_ = (this->aux_cht_).capa_size_.mask_;
  sStack_208.bits_ = (this->aux_cht_).quo_size_.bits_;
  sStack_208._4_4_ = *(undefined4 *)&(this->aux_cht_).quo_size_.field_0x4;
  sStack_208.mask_ = (this->aux_cht_).quo_size_.mask_;
  uStack_1f8 = (this->aux_cht_).quo_shift_;
  uStack_1f0 = (this->aux_cht_).quo_invmask_;
  local_1e8 = (this->aux_map_).table_.
              super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
              ._M_impl.super__Vector_impl_data._M_start;
  psStack_1e0 = (this->aux_map_).table_.
                super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_1d8 = (this->aux_map_).table_.
              super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->aux_map_).table_.
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar5 = &(this->aux_map_).table_;
  (pvVar5->
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)local_338.first;
  (pvVar5->
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)local_338.second;
  local_1d0 = (this->aux_map_).size_;
  uStack_1c8 = (this->aux_map_).max_size_;
  sStack_1c0.bits_ = (this->aux_map_).capa_size_.bits_;
  sStack_1c0._4_4_ = *(undefined4 *)&(this->aux_map_).capa_size_.field_0x4;
  sStack_1c0.mask_ = (this->aux_map_).capa_size_.mask_;
  uStack_1b0 = this->size_;
  uStack_1a8 = this->max_size_;
  local_1a0.bits_ = (this->capa_size_).bits_;
  local_1a0._4_4_ = *(undefined4 *)&(this->capa_size_).field_0x4;
  local_1a0.mask_ = (this->capa_size_).mask_;
  sStack_190.bits_ = (this->symb_size_).bits_;
  sStack_190._4_4_ = *(undefined4 *)&(this->symb_size_).field_0x4;
  sStack_190.mask_ = (this->symb_size_).mask_;
  local_308 = (undefined1  [16])local_338;
  unique0x100018cd = (undefined1  [16])local_338;
  operator=(this,&local_178);
  operator=(&local_178,
            (compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
             *)local_2c8);
  ~compact_bonsai_trie
            ((compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
              *)local_2c8);
  if (local_358.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
    operator_delete(local_358.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_358.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_358.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_338.first != (pointer)0x0) {
    operator_delete((void *)local_338.first,(long)local_328 - local_338.first);
  }
  if ((pointer)local_308._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_308._0_8_,(long)puStack_2f8 - local_308._0_8_);
  }
  ~compact_bonsai_trie(&local_178);
  return pnVar8;
}

Assistant:

node_map expand() {
        // this_type new_ht{capa_bits() + 1, symb_size_.bits(), aux_cht_.capa_bits()};
        this_type new_ht{capa_bits() + 1, symb_size_.bits()};
        new_ht.add_root();

#ifdef POPLAR_EXTRA_STATS
        new_ht.num_resize_ = num_resize_ + 1;
#endif

        bit_vector done_flags(capa_size());
        done_flags.set(get_root());

        size_p2 low_size{table_.width()};
        compact_vector map_high;

        if (low_size.bits() < new_ht.capa_bits()) {
            map_high = compact_vector(capa_size(), new_ht.capa_bits() - low_size.bits());
        }

        std::vector<std::pair<uint64_t, uint64_t>> path;
        path.reserve(256);

        auto get_mapping = [&](uint64_t i) -> uint64_t {
            if (map_high.size() == 0) {
                return table_[i];
            } else {
                return table_[i] | (map_high[i] << low_size.bits());
            }
        };

        auto set_mapping = [&](uint64_t i, uint64_t v) {
            if (map_high.size() == 0) {
                table_.set(i, v);
            } else {
                table_.set(i, v & low_size.mask());
                map_high.set(i, v >> low_size.bits());
            }
        };

        // 0 is root
        for (uint64_t i = 1; i < table_.size(); ++i) {
            if (done_flags[i] or compare_dsp_(i, 0)) {
                // skip already processed or empty elements
                continue;
            }

            path.clear();
            uint64_t node_id = i;

            do {
                auto [parent, label] = get_parent_and_symb(node_id);
                assert(parent != nil_id);
                path.emplace_back(std::make_pair(node_id, label));
                node_id = parent;
            } while (!done_flags[node_id]);

            uint64_t new_node_id = get_mapping(node_id);

            for (auto rit = std::rbegin(path); rit != std::rend(path); ++rit) {
                new_ht.add_child(new_node_id, rit->second);
                set_mapping(rit->first, new_node_id);
                done_flags.set(rit->first);
            }
        }

        node_map node_map{std::move(map_high), std::move(table_), std::move(done_flags)};
        std::swap(*this, new_ht);

        return node_map;
    }